

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

DeviceData * __thiscall
QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData>::value
          (DeviceData *__return_storage_ptr__,
          QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData> *this,QPaintDevice **key)

{
  undefined1 *puVar1;
  Node<QPaintDevice_*,_QGraphicsItemCache::DeviceData> *pNVar2;
  long lVar3;
  DeviceData *pDVar4;
  qreal *pqVar5;
  DeviceData *pDVar6;
  byte bVar7;
  
  bVar7 = 0;
  if ((this->d != (Data *)0x0) &&
     (pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QPaintDevice*,QGraphicsItemCache::DeviceData>>
               ::findNode<QPaintDevice*>
                         ((Data<QHashPrivate::Node<QPaintDevice*,QGraphicsItemCache::DeviceData>> *)
                          this->d,key),
     pNVar2 != (Node<QPaintDevice_*,_QGraphicsItemCache::DeviceData> *)0x0)) {
    pDVar4 = &pNVar2->value;
    pDVar6 = __return_storage_ptr__;
    for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pDVar6->lastTransform).m_matrix[0][0] = (pDVar4->lastTransform).m_matrix[0][0];
      pDVar4 = (DeviceData *)((long)pDVar4 + (ulong)bVar7 * -0x10 + 8);
      pDVar6 = (DeviceData *)((long)pDVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    QPixmapCache::Key::Key(&__return_storage_ptr__->key,&(pNVar2->value).key);
    return __return_storage_ptr__;
  }
  pqVar5 = (qreal *)&DAT_006f3c18;
  pDVar4 = __return_storage_ptr__;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pDVar4->lastTransform).m_matrix[0][0] = *pqVar5;
    pqVar5 = pqVar5 + (ulong)bVar7 * -2 + 1;
    pDVar4 = (DeviceData *)((long)pDVar4 + (ulong)bVar7 * -0x10 + 8);
  }
  puVar1 = &(__return_storage_ptr__->lastTransform).field_0x48;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfc00;
  (__return_storage_ptr__->cacheIndent).xp = 0;
  (__return_storage_ptr__->cacheIndent).yp = 0;
  QPixmapCache::Key::Key(&__return_storage_ptr__->key);
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }